

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

FIOBJ fiobj_hash_get(FIOBJ hash,FIOBJ key)

{
  uint64_t hash_value;
  fio_hash____map_s_ *pfVar1;
  FIOBJ FVar2;
  FIOBJ in_RCX;
  fio_hash___couplet_s obj;
  
  if (((uint)hash & 7) == 4) {
    hash_value = fiobj_obj2hash(key);
    obj.obj = in_RCX;
    obj.key = key;
    pfVar1 = fio_hash____find_map_pos_
                       ((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,obj);
    if ((pfVar1 == (fio_hash____map_s_ *)0x0) || (pfVar1->pos == (fio_hash____ordered_s_ *)0x0)) {
      FVar2 = 0;
    }
    else {
      FVar2 = (pfVar1->pos->obj).obj;
    }
    return FVar2;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x12a,"FIOBJ fiobj_hash_get(const FIOBJ, FIOBJ)");
}

Assistant:

FIOBJ fiobj_hash_get(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key);
  ;
}